

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D5xNvmFlash.cpp
# Opt level: O0

void __thiscall D5xNvmFlash::command(D5xNvmFlash *this,uint8_t cmd)

{
  uint16_t uVar1;
  FlashCmdError *this_00;
  uint8_t cmd_local;
  D5xNvmFlash *this_local;
  
  waitReady(this);
  writeRegU32(this,'\x04',cmd | 0xa500);
  waitReady(this);
  uVar1 = readRegU16(this,'\x10');
  if ((uVar1 & 0xce) != 0) {
    writeRegU16(this,'\x10',0xce);
    this_00 = (FlashCmdError *)__cxa_allocate_exception(8);
    FlashCmdError::FlashCmdError(this_00);
    __cxa_throw(this_00,&FlashCmdError::typeinfo,FlashCmdError::~FlashCmdError);
  }
  return;
}

Assistant:

void
D5xNvmFlash::command(uint8_t cmd)
{
    waitReady();

    writeRegU32(NVM_REG_CTRLB, CMDEX_KEY | cmd);

    waitReady();

    if (readRegU16(NVM_REG_INTFLAG) & 0xce)
    {
        // Clear the error bits
        writeRegU16(NVM_REG_INTFLAG, 0xce);
        throw FlashCmdError();
    }
}